

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O2

uint64_t SharpYUVUpdateY_SSE2(uint16_t *ref,uint16_t *src,uint16_t *dst,int len)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  uint uVar5;
  uint16_t uVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  short sVar13;
  ushort uVar14;
  short sVar15;
  ushort uVar16;
  short sVar17;
  ushort uVar18;
  short sVar19;
  ushort uVar20;
  short sVar21;
  ushort uVar22;
  short sVar23;
  ushort uVar24;
  short sVar25;
  ushort uVar26;
  short sVar27;
  ushort uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  auVar3 = _DAT_00147940;
  iVar9 = 0;
  iVar10 = 0;
  iVar11 = 0;
  iVar12 = 0;
  lVar8 = 0;
  while (lVar8 + 8 <= (long)len) {
    puVar1 = ref + lVar8;
    puVar2 = src + lVar8;
    auVar30._0_2_ = *puVar1 - *puVar2;
    auVar30._2_2_ = puVar1[1] - puVar2[1];
    auVar30._4_2_ = puVar1[2] - puVar2[2];
    auVar30._6_2_ = puVar1[3] - puVar2[3];
    auVar30._8_2_ = puVar1[4] - puVar2[4];
    auVar30._10_2_ = puVar1[5] - puVar2[5];
    auVar30._12_2_ = puVar1[6] - puVar2[6];
    auVar30._14_2_ = puVar1[7] - puVar2[7];
    puVar1 = dst + lVar8;
    auVar29 = psraw(auVar30,0xf);
    sVar13 = *puVar1 + auVar30._0_2_;
    sVar15 = puVar1[1] + auVar30._2_2_;
    sVar17 = puVar1[2] + auVar30._4_2_;
    sVar19 = puVar1[3] + auVar30._6_2_;
    sVar21 = puVar1[4] + auVar30._8_2_;
    sVar23 = puVar1[5] + auVar30._10_2_;
    sVar25 = puVar1[6] + auVar30._12_2_;
    sVar27 = puVar1[7] + auVar30._14_2_;
    uVar14 = (ushort)(0x3ff < sVar13) * 0x3ff | (ushort)(0x3ff >= sVar13) * sVar13;
    uVar16 = (ushort)(0x3ff < sVar15) * 0x3ff | (ushort)(0x3ff >= sVar15) * sVar15;
    uVar18 = (ushort)(0x3ff < sVar17) * 0x3ff | (ushort)(0x3ff >= sVar17) * sVar17;
    uVar20 = (ushort)(0x3ff < sVar19) * 0x3ff | (ushort)(0x3ff >= sVar19) * sVar19;
    uVar22 = (ushort)(0x3ff < sVar21) * 0x3ff | (ushort)(0x3ff >= sVar21) * sVar21;
    uVar24 = (ushort)(0x3ff < sVar23) * 0x3ff | (ushort)(0x3ff >= sVar23) * sVar23;
    uVar26 = (ushort)(0x3ff < sVar25) * 0x3ff | (ushort)(0x3ff >= sVar25) * sVar25;
    uVar28 = (ushort)(0x3ff < sVar27) * 0x3ff | (ushort)(0x3ff >= sVar27) * sVar27;
    auVar30 = pmaddwd(auVar29 | auVar3,auVar30);
    puVar1 = dst + lVar8;
    *puVar1 = (-1 < (short)uVar14) * uVar14;
    puVar1[1] = (-1 < (short)uVar16) * uVar16;
    puVar1[2] = (-1 < (short)uVar18) * uVar18;
    puVar1[3] = (-1 < (short)uVar20) * uVar20;
    puVar1[4] = (-1 < (short)uVar22) * uVar22;
    puVar1[5] = (-1 < (short)uVar24) * uVar24;
    puVar1[6] = (-1 < (short)uVar26) * uVar26;
    puVar1[7] = (-1 < (short)uVar28) * uVar28;
    iVar9 = iVar9 + auVar30._0_4_;
    iVar10 = iVar10 + auVar30._4_4_;
    iVar11 = iVar11 + auVar30._8_4_;
    iVar12 = iVar12 + auVar30._12_4_;
    lVar8 = lVar8 + 8;
  }
  uVar4 = (ulong)(uint)(iVar12 + iVar10 + iVar11 + iVar9);
  for (; lVar8 < len; lVar8 = lVar8 + 1) {
    iVar9 = (uint)ref[lVar8] - (uint)src[lVar8];
    uVar5 = (uint)dst[lVar8] + iVar9;
    uVar7 = 0x3ff;
    if (uVar5 < 0x3ff) {
      uVar7 = uVar5;
    }
    uVar6 = (uint16_t)uVar7;
    if ((int)uVar5 < 0) {
      uVar6 = 0;
    }
    iVar10 = -iVar9;
    if (0 < iVar9) {
      iVar10 = iVar9;
    }
    dst[lVar8] = uVar6;
    uVar4 = uVar4 + (ushort)iVar10;
  }
  return uVar4;
}

Assistant:

static uint64_t SharpYUVUpdateY_SSE2(const uint16_t* ref, const uint16_t* src,
                                     uint16_t* dst, int len) {
  uint64_t diff = 0;
  uint32_t tmp[4];
  int i;
  const __m128i zero = _mm_setzero_si128();
  const __m128i max = _mm_set1_epi16(MAX_Y);
  const __m128i one = _mm_set1_epi16(1);
  __m128i sum = zero;

  for (i = 0; i + 8 <= len; i += 8) {
    const __m128i A = _mm_loadu_si128((const __m128i*)(ref + i));
    const __m128i B = _mm_loadu_si128((const __m128i*)(src + i));
    const __m128i C = _mm_loadu_si128((const __m128i*)(dst + i));
    const __m128i D = _mm_sub_epi16(A, B);       // diff_y
    const __m128i E = _mm_cmpgt_epi16(zero, D);  // sign (-1 or 0)
    const __m128i F = _mm_add_epi16(C, D);       // new_y
    const __m128i G = _mm_or_si128(E, one);      // -1 or 1
    const __m128i H = _mm_max_epi16(_mm_min_epi16(F, max), zero);
    const __m128i I = _mm_madd_epi16(D, G);      // sum(abs(...))
    _mm_storeu_si128((__m128i*)(dst + i), H);
    sum = _mm_add_epi32(sum, I);
  }
  _mm_storeu_si128((__m128i*)tmp, sum);
  diff = tmp[3] + tmp[2] + tmp[1] + tmp[0];
  for (; i < len; ++i) {
    const int diff_y = ref[i] - src[i];
    const int new_y = (int)dst[i] + diff_y;
    dst[i] = clip_y(new_y);
    diff += (uint64_t)abs(diff_y);
  }
  return diff;
}